

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc.c
# Opt level: O0

int Saig_ManBmcSimple(Aig_Man_t *pAig,int nFrames,int nSizeMax,int nConfLimit,int fRewrite,
                     int fVerbose,int *piFrame,int nCofFanLit,int fUseSatoko)

{
  Aig_Man_t *pAig_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  abctime aVar10;
  satoko_stats_t *psVar11;
  Vec_Int_t *p;
  Abc_Cex_t *pAVar12;
  int *local_178;
  long local_170;
  long local_160;
  int local_134;
  int *pModel;
  Vec_Int_t *vCiIds;
  abctime clkPart;
  satoko_opts_t opts;
  abctime clk;
  int RetValue;
  int i;
  int Lit;
  int status;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAigTemp;
  Aig_Man_t *pFrames;
  Cnf_Dat_t *pCnf;
  satoko_t *pSat2;
  sat_solver *pSat;
  int local_28;
  int fVerbose_local;
  int fRewrite_local;
  int nConfLimit_local;
  int nSizeMax_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  pSat2 = (satoko_t *)0x0;
  pCnf = (Cnf_Dat_t *)0x0;
  clk._0_4_ = -1;
  pSat._4_4_ = fVerbose;
  local_28 = fRewrite;
  fVerbose_local = nConfLimit;
  fRewrite_local = nSizeMax;
  nConfLimit_local = nFrames;
  _nSizeMax_local = pAig;
  opts._96_8_ = Abc_Clock();
  if (nCofFanLit == 0) {
    if (fRewrite_local < 1) {
      pAigTemp = Saig_ManFramesBmc(_nSizeMax_local,nConfLimit_local);
    }
    else {
      pAigTemp = Saig_ManFramesBmcLimit(_nSizeMax_local,nConfLimit_local,fRewrite_local);
      iVar8 = Aig_ManCoNum(pAigTemp);
      iVar9 = Saig_ManPoNum(_nSizeMax_local);
      iVar1 = Aig_ManCoNum(pAigTemp);
      iVar2 = Saig_ManPoNum(_nSizeMax_local);
      nConfLimit_local = iVar8 / iVar9 + (uint)(0 < iVar1 % iVar2);
    }
  }
  else {
    pAigTemp = Gia_ManCofactorAig(_nSizeMax_local,nConfLimit_local,nCofFanLit);
    if (pAigTemp == (Aig_Man_t *)0x0) {
      return -1;
    }
  }
  if (piFrame != (int *)0x0) {
    *piFrame = nConfLimit_local;
  }
  if (pSat._4_4_ != 0) {
    uVar3 = Saig_ManPiNum(_nSizeMax_local);
    uVar4 = Saig_ManPoNum(_nSizeMax_local);
    uVar5 = Saig_ManRegNum(_nSizeMax_local);
    uVar6 = Aig_ManNodeNum(_nSizeMax_local);
    uVar7 = Aig_ManLevelNum(_nSizeMax_local);
    printf("Running \"bmc\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)uVar3,
           (ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
    iVar8 = nConfLimit_local;
    uVar3 = Aig_ManCiNum(pAigTemp);
    uVar4 = Aig_ManCoNum(pAigTemp);
    uVar5 = Aig_ManNodeNum(pAigTemp);
    uVar6 = Aig_ManLevelNum(pAigTemp);
    printf("Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ",(ulong)(uint)iVar8,
           (ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
    Abc_Print(1,"%s =","Time");
    aVar10 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - opts._96_8_) * 1.0) / 1000000.0);
    fflush(_stdout);
  }
  if (local_28 != 0) {
    opts._96_8_ = Abc_Clock();
    pObj = (Aig_Obj_t *)pAigTemp;
    pAigTemp = Dar_ManRwsat(pAigTemp,1,0);
    Aig_ManStop((Aig_Man_t *)pObj);
    if (pSat._4_4_ != 0) {
      uVar3 = Aig_ManNodeNum(pAigTemp);
      uVar4 = Aig_ManLevelNum(pAigTemp);
      printf("Time-frames after rewriting:  Node = %6d. Lev = %5d.  ",(ulong)uVar3,(ulong)uVar4);
      Abc_Print(1,"%s =","Time");
      aVar10 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - opts._96_8_) * 1.0) / 1000000.0);
      fflush(_stdout);
    }
  }
  opts._96_8_ = Abc_Clock();
  pAig_00 = pAigTemp;
  iVar8 = Aig_ManCoNum(pAigTemp);
  pFrames = (Aig_Man_t *)Cnf_Derive(pAig_00,iVar8);
  if (fUseSatoko == 0) {
    pSat2 = (satoko_t *)sat_solver_new();
    sat_solver_setnvars((sat_solver *)pSat2,*(int *)&pFrames->pSpec);
    for (clk._4_4_ = 0; clk._4_4_ < *(int *)&pFrames->vCis; clk._4_4_ = clk._4_4_ + 1) {
      iVar8 = sat_solver_addclause
                        ((sat_solver *)pSat2,*(lit **)(&pFrames->vCos->nCap + (long)clk._4_4_ * 2),
                         *(lit **)(&pFrames->vCos->nCap + (long)(clk._4_4_ + 1) * 2));
      if (iVar8 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc.c"
                      ,0x11c,
                      "int Saig_ManBmcSimple(Aig_Man_t *, int, int, int, int, int, int *, int, int)"
                     );
      }
    }
  }
  else {
    satoko_default_opts((satoko_opts_t *)&clkPart);
    clkPart = (abctime)fVerbose_local;
    pCnf = (Cnf_Dat_t *)satoko_create();
    satoko_configure((satoko_t *)pCnf,(satoko_opts_t *)&clkPart);
    satoko_setnvars((solver_t *)pCnf,*(int *)&pFrames->pSpec);
    for (clk._4_4_ = 0; clk._4_4_ < *(int *)&pFrames->vCis; clk._4_4_ = clk._4_4_ + 1) {
      iVar8 = satoko_add_clause((solver_t *)pCnf,
                                *(int **)(&pFrames->vCos->nCap + (long)clk._4_4_ * 2),
                                (int)(*(long *)(&pFrames->vCos->nCap + (long)(clk._4_4_ + 1) * 2) -
                                      *(long *)(&pFrames->vCos->nCap + (long)clk._4_4_ * 2) >> 2));
      if (iVar8 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc.c"
                      ,0x114,
                      "int Saig_ManBmcSimple(Aig_Man_t *, int, int, int, int, int, int *, int, int)"
                     );
      }
    }
  }
  if (pSat._4_4_ != 0) {
    printf("CNF: Variables = %6d. Clauses = %7d. Literals = %8d. ",(ulong)*(uint *)&pFrames->pSpec,
           (ulong)*(uint *)&pFrames->vCis,(ulong)*(uint *)((long)&pFrames->pSpec + 4));
    Abc_Print(1,"%s =","Time");
    aVar10 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - opts._96_8_) * 1.0) / 1000000.0);
    fflush(_stdout);
  }
  if (pSat2 == (satoko_t *)0x0) {
    local_134 = 1;
  }
  else {
    local_134 = sat_solver_simplify((sat_solver *)pSat2);
  }
  i = local_134;
  if (local_134 == 0) {
    if (pSat._4_4_ != 0) {
      printf("The BMC problem is trivially UNSAT\n");
      fflush(_stdout);
    }
  }
  else {
    vCiIds = (Vec_Int_t *)Abc_Clock();
    for (clk._4_4_ = 0; iVar8 = Vec_PtrSize(pAigTemp->vCos), clk._4_4_ < iVar8;
        clk._4_4_ = clk._4_4_ + 1) {
      _Lit = Vec_PtrEntry(pAigTemp->vCos,clk._4_4_);
      RetValue = toLitCond((&pFrames->vObjs->nCap)[*(int *)((long)_Lit + 0x24)],0);
      if (pSat._4_4_ != 0) {
        iVar8 = Saig_ManPoNum(_nSizeMax_local);
        iVar9 = Saig_ManPoNum(_nSizeMax_local);
        printf("Solving output %2d of frame %3d ... \r",(ulong)(uint)(clk._4_4_ % iVar8),
               (long)clk._4_4_ / (long)iVar9 & 0xffffffff);
      }
      opts._96_8_ = Abc_Clock();
      if (pCnf == (Cnf_Dat_t *)0x0) {
        i = sat_solver_solve((sat_solver *)pSat2,&RetValue,&i,(long)fVerbose_local,0,0,0);
      }
      else {
        i = satoko_solve_assumptions_limit((satoko_t *)pCnf,&RetValue,1,fVerbose_local);
      }
      if (pSat._4_4_ != 0) {
        iVar8 = Saig_ManPoNum(_nSizeMax_local);
        iVar9 = Saig_ManPoNum(_nSizeMax_local);
        if (clk._4_4_ % iVar8 == iVar9 + -1) {
          uVar3 = Saig_ManPoNum(_nSizeMax_local);
          iVar8 = Saig_ManPoNum(_nSizeMax_local);
          printf("Solved %2d outputs of frame %3d.  ",(ulong)uVar3,
                 (long)clk._4_4_ / (long)iVar8 & 0xffffffff);
          if (pSat2 == (satoko_t *)0x0) {
            iVar8 = satoko_conflictnum((satoko_t *)pCnf);
            local_160 = (long)iVar8;
          }
          else {
            local_160._0_4_ = (pSat2->opts).lbd_freeze_clause;
            local_160._4_4_ = (pSat2->opts).learnt_ratio;
          }
          if (pSat2 == (satoko_t *)0x0) {
            psVar11 = satoko_stats((satoko_t *)pCnf);
            local_170 = psVar11->n_propagations;
          }
          else {
            local_170._0_4_ = (pSat2->opts).sz_trail_bqueue;
            local_170._4_4_ = (pSat2->opts).n_conf_fst_reduce;
          }
          printf("Conf =%8.0f. Imp =%11.0f. ",(double)local_160,(double)local_170);
          Abc_Print(1,"%s =","T");
          aVar10 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - (long)vCiIds) * 1.0) / 1000000.0);
          vCiIds = (Vec_Int_t *)Abc_Clock();
          fflush(_stdout);
        }
      }
      if (i != -1) {
        if (i == 1) {
          p = Cnf_DataCollectPiSatNums((Cnf_Dat_t *)pFrames,pAigTemp);
          if (pCnf == (Cnf_Dat_t *)0x0) {
            local_178 = Sat_SolverGetModel((sat_solver *)pSat2,p->pArray,p->nSize);
          }
          else {
            local_178 = Sat2_SolverGetModel((satoko_t *)pCnf,p->pArray,p->nSize);
          }
          iVar8 = *(int *)((long)_Lit + 0x24);
          iVar9 = Aig_ManCiNum(pAigTemp);
          local_178[iVar9] = iVar8;
          pAVar12 = Fra_SmlCopyCounterExample(_nSizeMax_local,pAigTemp,local_178);
          _nSizeMax_local->pSeqModel = pAVar12;
          if (local_178 != (int *)0x0) {
            free(local_178);
          }
          Vec_IntFree(p);
          if (piFrame != (int *)0x0) {
            iVar8 = Saig_ManPoNum(_nSizeMax_local);
            *piFrame = clk._4_4_ / iVar8;
          }
          clk._0_4_ = 0;
        }
        else {
          if (piFrame != (int *)0x0) {
            iVar8 = Saig_ManPoNum(_nSizeMax_local);
            *piFrame = clk._4_4_ / iVar8;
          }
          clk._0_4_ = -1;
        }
        break;
      }
    }
  }
  if (pSat2 != (satoko_t *)0x0) {
    sat_solver_delete((sat_solver *)pSat2);
  }
  if (pCnf != (Cnf_Dat_t *)0x0) {
    satoko_destroy((solver_t *)pCnf);
  }
  Cnf_DataFree((Cnf_Dat_t *)pFrames);
  Aig_ManStop(pAigTemp);
  return (int)clk;
}

Assistant:

int Saig_ManBmcSimple( Aig_Man_t * pAig, int nFrames, int nSizeMax, int nConfLimit, int fRewrite, int fVerbose, int * piFrame, int nCofFanLit, int fUseSatoko )
{
    extern Aig_Man_t * Gia_ManCofactorAig( Aig_Man_t * p, int nFrames, int nCofFanLit );
    sat_solver * pSat = NULL;
    satoko_t * pSat2 = NULL;
    Cnf_Dat_t * pCnf;
    Aig_Man_t * pFrames, * pAigTemp;
    Aig_Obj_t * pObj;
    int status, Lit, i, RetValue = -1;
    abctime clk;

    // derive the timeframes
    clk = Abc_Clock();
    if ( nCofFanLit )
    {
        pFrames = Gia_ManCofactorAig( pAig, nFrames, nCofFanLit );
        if ( pFrames == NULL )
            return -1;
    }
    else if ( nSizeMax > 0 )
    {
        pFrames = Saig_ManFramesBmcLimit( pAig, nFrames, nSizeMax );
        nFrames = Aig_ManCoNum(pFrames) / Saig_ManPoNum(pAig) + ((Aig_ManCoNum(pFrames) % Saig_ManPoNum(pAig)) > 0);
    }
    else
        pFrames = Saig_ManFramesBmc( pAig, nFrames );
    if ( piFrame )
        *piFrame = nFrames;
    if ( fVerbose )
    {
        printf( "Running \"bmc\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ", 
            nFrames, Aig_ManCiNum(pFrames), Aig_ManCoNum(pFrames), 
            Aig_ManNodeNum(pFrames), Aig_ManLevelNum(pFrames) );
        ABC_PRT( "Time", Abc_Clock() - clk );
        fflush( stdout );
    }
    // rewrite the timeframes
    if ( fRewrite )
    {
        clk = Abc_Clock();
//        pFrames = Dar_ManBalance( pAigTemp = pFrames, 0 );
        pFrames = Dar_ManRwsat( pAigTemp = pFrames, 1, 0 );
        Aig_ManStop( pAigTemp );
        if ( fVerbose )
        {
            printf( "Time-frames after rewriting:  Node = %6d. Lev = %5d.  ", 
                Aig_ManNodeNum(pFrames), Aig_ManLevelNum(pFrames) );
            ABC_PRT( "Time", Abc_Clock() - clk );
            fflush( stdout );
        }
    }
    // create the SAT solver
    clk = Abc_Clock();
    pCnf = Cnf_Derive( pFrames, Aig_ManCoNum(pFrames) );  
//if ( s_fInterrupt )
//return -1;
    if ( fUseSatoko )
    {
        satoko_opts_t opts;
        satoko_default_opts(&opts);
        opts.conf_limit = nConfLimit;
        pSat2 = satoko_create();  
        satoko_configure(pSat2, &opts);
        satoko_setnvars(pSat2, pCnf->nVars);
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !satoko_add_clause( pSat2, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
                assert( 0 );
    }
    else
    {
        pSat = sat_solver_new();
        sat_solver_setnvars( pSat, pCnf->nVars );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
    }
    if ( fVerbose )
    {
        printf( "CNF: Variables = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
        ABC_PRT( "Time", Abc_Clock() - clk );
        fflush( stdout );
    }
    status = pSat ? sat_solver_simplify(pSat) : 1;
    if ( status == 0 )
    {
        if ( fVerbose )
        {
            printf( "The BMC problem is trivially UNSAT\n" );
            fflush( stdout );
        }
    }
    else
    {
        abctime clkPart = Abc_Clock();
        Aig_ManForEachCo( pFrames, pObj, i )
        {
            Lit = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
            if ( fVerbose )
            {
                printf( "Solving output %2d of frame %3d ... \r", 
                    i % Saig_ManPoNum(pAig), i / Saig_ManPoNum(pAig) );
            }
            clk = Abc_Clock();
            if ( pSat2 )
                status = satoko_solve_assumptions_limit( pSat2, &Lit, 1, nConfLimit );
            else
                status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            if ( fVerbose && (i % Saig_ManPoNum(pAig) == Saig_ManPoNum(pAig) - 1) )
            {
                printf( "Solved %2d outputs of frame %3d.  ", 
                    Saig_ManPoNum(pAig), i / Saig_ManPoNum(pAig) );
                printf( "Conf =%8.0f. Imp =%11.0f. ", 
                    (double)(pSat ? pSat->stats.conflicts    : satoko_conflictnum(pSat2)), 
                    (double)(pSat ? pSat->stats.propagations : satoko_stats(pSat2)->n_propagations) );
                ABC_PRT( "T", Abc_Clock() - clkPart );
                clkPart = Abc_Clock();
                fflush( stdout );
            }
            if ( status == l_False )
            {
/*
                Lit = lit_neg( Lit );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
                assert( RetValue );
                if ( pSat->qtail != pSat->qhead )
                {
                    RetValue = sat_solver_simplify(pSat);
                    assert( RetValue );
                }
*/
            }
            else if ( status == l_True )
            {
                Vec_Int_t * vCiIds = Cnf_DataCollectPiSatNums( pCnf, pFrames );
                int * pModel = pSat2 ? Sat2_SolverGetModel(pSat2, vCiIds->pArray, vCiIds->nSize) : Sat_SolverGetModel(pSat, vCiIds->pArray, vCiIds->nSize);
                pModel[Aig_ManCiNum(pFrames)] = pObj->Id;
                pAig->pSeqModel = Fra_SmlCopyCounterExample( pAig, pFrames, pModel );
                ABC_FREE( pModel );
                Vec_IntFree( vCiIds );

                if ( piFrame )
                    *piFrame = i / Saig_ManPoNum(pAig);
                RetValue = 0;
                break;
            }
            else
            {
                if ( piFrame )
                    *piFrame = i / Saig_ManPoNum(pAig);
                RetValue = -1;
                break;
            }
        }
    }
    if ( pSat )  sat_solver_delete( pSat );
    if ( pSat2 ) satoko_destroy( pSat2 );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pFrames );
    return RetValue;
}